

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::RegistryWithPred<el::Configuration,_el::Configuration::Predicate>::unregister
          (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this,
          Configuration **ptr)

{
  Configuration *pCVar1;
  bool bVar2;
  reference ppCVar3;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  *__i;
  long *in_RSI;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *in_RDI;
  iterator iter;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar4;
  const_iterator in_stack_ffffffffffffffc8;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_18;
  long *local_10;
  
  if (*in_RSI != 0) {
    local_10 = in_RSI;
    local_18._M_current =
         (Configuration **)
         (*(code *)(in_RDI->
                   super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[5])();
    while( true ) {
      (*(code *)(in_RDI->
                super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>).
                _M_impl.super__Vector_impl_data._M_start[6])();
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffa8);
      if ((!bVar2) ||
         (pCVar1 = (Configuration *)*local_10,
         ppCVar3 = __gnu_cxx::
                   __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                   ::operator*(&local_18), pCVar1 == *ppCVar3)) break;
      __gnu_cxx::
      __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      ::operator++(&local_18);
    }
    (*(code *)(in_RDI->super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>
              )._M_impl.super__Vector_impl_data._M_start[6])();
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    uVar4 = false;
    if (bVar2) {
      ppCVar3 = __gnu_cxx::
                __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                ::operator*(&local_18);
      uVar4 = *ppCVar3 != (Configuration *)0x0;
    }
    if ((bool)uVar4 != false) {
      __i = (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
             *)(*(code *)(in_RDI->
                         super__Vector_base<el::Configuration_*,_std::allocator<el::Configuration_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[0xb])();
      __gnu_cxx::
      __normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
      ::__normal_iterator<el::Configuration**>
                ((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                  *)CONCAT17(uVar4,in_stack_ffffffffffffffb0),__i);
      std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::erase
                (in_RDI,in_stack_ffffffffffffffc8);
      __gnu_cxx::
      __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      ::operator*(&local_18);
      safeDelete<el::Configuration>((Configuration **)CONCAT17(uVar4,in_stack_ffffffffffffffb0));
    }
  }
  return;
}

Assistant:

virtual void unregister(T_Ptr*& ptr) ELPP_FINAL {
    if (ptr) {
      iterator iter = this->begin();
      for (; iter != this->end(); ++iter) {
        if (ptr == *iter) {
          break;
        }
      }
      if (iter != this->end() && *iter != nullptr) {
        this->list().erase(iter);
        base::utils::safeDelete(*iter);
      }
    }
  }